

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_nvector.c
# Opt level: O2

int Test_N_VL1NormLocal(N_Vector X,sunindextype param_2,int myid)

{
  int iVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  
  set_element_range(X,0,param_2 + -1,-(double)myid / (double)param_2);
  dVar2 = get_time();
  dVar3 = (double)N_VL1NormLocal(X);
  sync_device(X);
  dVar4 = get_time();
  if (0.0 <= dVar3) {
    iVar1 = SUNRCompareTol(dVar3,(double)myid,0x3e50000000000000);
    if (iVar1 == 0) {
      iVar1 = 0;
      if (myid == 0) {
        puts("PASSED test -- N_VL1NormLocal");
      }
      goto LAB_0010bafc;
    }
  }
  printf(">>> FAILED test -- N_VL1NormLocal, Proc %d\n",(ulong)(uint)myid);
  iVar1 = 1;
LAB_0010bafc:
  max_time(X,dVar4 - dVar2);
  if (print_time != 0) {
    printf("%s Time: %22.15e\n\n","N_VL1NormLocal");
  }
  return iVar1;
}

Assistant:

int Test_N_VL1NormLocal(N_Vector X, sunindextype local_length, int myid)
{
  int fails = 0, failure = 0;
  double start_time, stop_time, maxt;
  sunrealtype ans, val;

  /* fill vector data */
  val = -(ONE * myid) / local_length;
  set_element_range(X, 0, local_length - 1, val);

  start_time = get_time();
  ans        = N_VL1NormLocal(X);
  sync_device(X);
  stop_time = get_time();

  /* ans should equal myid */
  failure = (ans < ZERO) ? 1
                         : SUNRCompareTol(ans, (sunrealtype)myid,
                                          SUNRsqrt(SUN_UNIT_ROUNDOFF));

  if (failure)
  {
    printf(">>> FAILED test -- N_VL1NormLocal, Proc %d\n", myid);
    fails++;
  }
  else if (myid == 0) { printf("PASSED test -- N_VL1NormLocal\n"); }

  /* find max time across all processes */
  maxt = max_time(X, stop_time - start_time);
  PRINT_TIME("N_VL1NormLocal", maxt);

  return (fails);
}